

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parse.cc
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_3d5b::Reactor::dictionaryItem(Reactor *this,string *key,JSON *value)

{
  bool bVar1;
  ostream *poVar2;
  char *j;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"dictionary item: ");
  poVar2 = std::operator<<(poVar2,(string *)key);
  j = " -> ";
  std::operator<<(poVar2," -> ");
  printItem((Reactor *)value,(JSON *)j);
  bVar1 = std::operator==(key,"keep");
  return !bVar1;
}

Assistant:

bool
Reactor::dictionaryItem(std::string const& key, JSON const& value)
{
    std::cout << "dictionary item: " << key << " -> ";
    printItem(value);
    if (key == "keep") {
        return false;
    }
    return true;
}